

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotprecv.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  __u32 force_rx_stmin;
  ulong uStack_10610;
  ulong uStack_10608;
  sockaddr_can addr;
  uchar msg [67000];
  
  force_rx_stmin = 0;
  addr.can_addr.j1939.name = 0xffffffffffffffff;
  uStack_10608 = 0xffffffffffffffff;
  uStack_10610 = 0xffffffffffffffff;
  bVar3 = false;
  do {
    bVar2 = bVar3;
    uVar4 = getopt(argc,argv,"s:d:x:p:P:b:m:w:f:lL:?");
    bVar3 = true;
    switch(uVar4) {
    case 0x62:
      uVar8 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.bs = (__u8)uVar8;
      bVar3 = bVar2;
      break;
    case 99:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
switchD_00101439_caseD_71:
      fprintf(_stderr,"Unknown option %c\n",(ulong)uVar4);
LAB_0010182e:
      pcVar9 = __xpg_basename(*argv);
      print_usage(pcVar9);
LAB_0010183e:
      exit(1);
    case 100:
      uStack_10608 = strtoul(_optarg,(char **)0x0,0x10);
      addr.can_addr.tp.rx_id = (canid_t)uStack_10608;
      sVar7 = strlen(_optarg);
      bVar3 = bVar2;
      if (7 < sVar7) {
        uVar4 = (uint)uStack_10608;
        uStack_10608 = (ulong)(uVar4 | 0x80000000);
        addr.can_addr.j1939.name = CONCAT44(addr.can_addr.tp.tx_id,uVar4) | 0x80000000;
      }
      break;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x100;
      uVar8 = strtoul(_optarg,(char **)0x0,10);
      force_rx_stmin = (__u32)uVar8;
      bVar3 = bVar2;
      break;
    case 0x6c:
      break;
    case 0x6d:
      uVar8 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.stmin = (__u8)uVar8;
      bVar3 = bVar2;
      break;
    default:
      switch(uVar4) {
      case 0x70:
        iVar5 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c5,0x1040c6);
        if (iVar5 == 2) {
          main::opts.flags = main::opts.flags | 0xc;
          bVar3 = bVar2;
        }
        else if (iVar5 == 1) {
          main::opts.flags = main::opts.flags | 4;
          bVar3 = bVar2;
        }
        else {
          iVar5 = __isoc99_sscanf(_optarg,":%hhx",0x1040c6);
          if (iVar5 != 1) {
            pcVar9 = "incorrect padding values \'%s\'.\n";
LAB_0010187e:
            printf(pcVar9,_optarg);
LAB_00101885:
            pcVar9 = __xpg_basename(*argv);
            print_usage(pcVar9);
            exit(0);
          }
          main::opts.flags = main::opts.flags | 8;
          bVar3 = bVar2;
        }
        break;
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
      case 0x76:
        goto switchD_00101439_caseD_71;
      case 0x73:
        uStack_10610 = strtoul(_optarg,(char **)0x0,0x10);
        addr.can_addr.tp.tx_id = (canid_t)uStack_10610;
        sVar7 = strlen(_optarg);
        bVar3 = bVar2;
        if (7 < sVar7) {
          uVar4 = (uint)uStack_10610;
          uStack_10610 = (ulong)(uVar4 | 0x80000000);
          addr.can_addr.j1939.name = CONCAT44(uVar4,addr.can_addr.tp.rx_id) | 0x8000000000000000;
        }
        break;
      case 0x77:
        uVar8 = strtoul(_optarg,(char **)0x0,0x10);
        main::fcopts.wftmax = (__u8)uVar8;
        bVar3 = bVar2;
        break;
      case 0x78:
        iVar5 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c4,0x1040c7);
        uVar4 = 2;
        if (iVar5 != 1) {
          if (iVar5 != 2) {
            pcVar9 = "incorrect extended addr values \'%s\'.\n";
            goto LAB_0010187e;
          }
          uVar4 = 0x202;
        }
        main::opts.flags = main::opts.flags | uVar4;
        bVar3 = bVar2;
        break;
      default:
        if (uVar4 == 0x4c) {
          iVar5 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040cc,0x1040cd);
          bVar3 = bVar2;
          if (iVar5 != 3) {
            pcVar9 = "unknown link layer options \'%s\'.\n";
            goto LAB_0010187e;
          }
        }
        else {
          if (uVar4 != 0x50) {
            if (uVar4 == 0xffffffff) {
              if (((argc - _optind != 1) || ((int)uStack_10610 == -1)) || ((int)uStack_10608 == -1))
              goto LAB_0010182e;
              iVar5 = socket(0x1d,2,6);
              if (iVar5 < 0) {
                pcVar9 = "socket";
              }
              else {
                setsockopt(iVar5,0x6a,1,&main::opts,0xc);
                setsockopt(iVar5,0x6a,2,&main::fcopts,3);
                if ((main::llopts.tx_dl == '\0') ||
                   (iVar6 = setsockopt(iVar5,0x6a,5,&main::llopts,3), -1 < iVar6)) {
                  if ((main::opts.flags & 0x100) != 0) {
                    setsockopt(iVar5,0x6a,4,&force_rx_stmin,4);
                  }
                  addr.can_family = 0x1d;
                  addr.can_ifindex = if_nametoindex(argv[_optind]);
                  if (addr.can_ifindex != 0) {
                    iVar6 = bind(iVar5,(sockaddr *)&addr,0x18);
                    if (-1 < iVar6) {
                      do {
                        uVar8 = read(iVar5,msg,67000);
                        if ((int)uVar8 - 1U < 66999) {
                          for (uVar10 = 0; (uVar8 & 0xffffffff) != uVar10; uVar10 = uVar10 + 1) {
                            printf("%02X ",(ulong)msg[uVar10]);
                          }
                        }
                        putchar(10);
                      } while (bVar2);
                      close(iVar5);
                      return 0;
                    }
                    perror("bind");
                    close(iVar5);
                    goto LAB_0010183e;
                  }
                  pcVar9 = "if_nametoindex";
                }
                else {
                  pcVar9 = "link layer sockopt";
                }
              }
              perror(pcVar9);
              goto LAB_0010183e;
            }
            if (uVar4 == 0x3f) goto LAB_00101885;
            goto switchD_00101439_caseD_71;
          }
          cVar1 = *_optarg;
          if (cVar1 == 'a') {
            main::opts.flags = main::opts.flags | 0x30;
            bVar3 = bVar2;
          }
          else if (cVar1 == 'c') {
            main::opts.flags = main::opts.flags | 0x20;
            bVar3 = bVar2;
          }
          else {
            if (cVar1 != 'l') {
              printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)cVar1);
              goto LAB_00101885;
            }
            main::opts.flags = main::opts.flags | 0x10;
            bVar3 = bVar2;
          }
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_fc_options fcopts;
    static struct can_isotp_ll_options llopts;
    int opt, i;
    extern int optind, opterr, optopt;
    __u32 force_rx_stmin = 0;
    int loop = 0;

    unsigned char msg[BUFSIZE];
    int nbytes;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:b:m:w:f:lL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'b':
		    fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'm':
		    fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'w':
		    fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_RXSTMIN;
		    force_rx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'l':
		    loop = 1;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	(addr.can_addr.tp.rx_id == NO_CAN_ID)) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }
  
    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_RXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RX_STMIN, &force_rx_stmin, sizeof(force_rx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    do {
	    nbytes = read(s, msg, BUFSIZE);
	    if (nbytes > 0 && nbytes < BUFSIZE)
		    for (i=0; i < nbytes; i++)
			    printf("%02X ", msg[i]);
	    printf("\n");
    } while (loop);

    close(s);

    return 0;
}